

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

void Ppmd7_Update1_0(CPpmd7 *p)

{
  byte bVar1;
  CPpmd7 *p_local;
  
  p->PrevSuccess = (uint)(p->MinContext->SummFreq < (ushort)((ushort)p->FoundState->Freq * 2));
  p->RunLength = p->PrevSuccess + p->RunLength;
  p->MinContext->SummFreq = p->MinContext->SummFreq + 4;
  bVar1 = p->FoundState->Freq + 4;
  p->FoundState->Freq = bVar1;
  if (0x7c < bVar1) {
    Rescale(p);
  }
  NextContext(p);
  return;
}

Assistant:

static void Ppmd7_Update1_0(CPpmd7 *p)
{
  p->PrevSuccess = (2 * p->FoundState->Freq > p->MinContext->SummFreq);
  p->RunLength += p->PrevSuccess;
  p->MinContext->SummFreq += 4;
  if ((p->FoundState->Freq += 4) > MAX_FREQ)
    Rescale(p);
  NextContext(p);
}